

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

QString * double2string(QString *__return_storage_ptr__,double num,int base,int ndigits,bool *oflow)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (base == 1) {
    uVar5 = ndigits;
    do {
      QString::asprintf((char *)&local_58,SUB84(num,0),"%*.*g",(ulong)(uint)ndigits,(ulong)uVar5);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      qVar4 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = qVar4;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_58.d.d = (Data *)pQVar1;
          local_58.d.ptr = pcVar2;
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      local_58.d.ptr = (__return_storage_ptr__->d).ptr;
      local_58.d.d = (Data *)(__return_storage_ptr__->d).size;
      qVar4 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x65,0,CaseSensitive);
      if (0 < qVar4) {
        pDVar3 = (__return_storage_ptr__->d).d;
        if ((pDVar3 == (Data *)0x0) ||
           (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData
                    ((longlong)__return_storage_ptr__,
                     (AllocationOption)(__return_storage_ptr__->d).size);
        }
        if ((__return_storage_ptr__->d).ptr[qVar4 + 1] == L'+') {
          pDVar3 = (__return_storage_ptr__->d).d;
          if ((pDVar3 == (Data *)0x0) ||
             (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData
                      ((longlong)__return_storage_ptr__,
                       (AllocationOption)(__return_storage_ptr__->d).size);
          }
          (__return_storage_ptr__->d).ptr[qVar4] = L' ';
          pDVar3 = (__return_storage_ptr__->d).d;
          if ((pDVar3 == (Data *)0x0) ||
             (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData
                      ((longlong)__return_storage_ptr__,
                       (AllocationOption)(__return_storage_ptr__->d).size);
          }
          (__return_storage_ptr__->d).ptr[qVar4 + 1] = L'e';
        }
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while ((bVar6) && (ndigits < (int)(__return_storage_ptr__->d).size));
    if (oflow == (bool *)0x0) goto LAB_0041c30a;
  }
  else {
    if (num < 2147483648.0 && -2147483648.0 <= num) {
      int2string(&local_58,(int)num,base,ndigits,(bool *)0x0);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_58.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_58.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_58.d.ptr._4_4_;
      qVar4 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.d = (Data *)pQVar1;
      local_58.d.ptr = pcVar2;
      local_58.d.size = qVar4;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    else if (oflow != (bool *)0x0) {
      *oflow = true;
    }
    if ((num >= 2147483648.0 || -2147483648.0 > num) || oflow == (bool *)0x0) goto LAB_0041c30a;
  }
  *oflow = ndigits < (int)(__return_storage_ptr__->d).size;
LAB_0041c30a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString double2string(double num, int base, int ndigits, bool *oflow)
{
    QString s;
    if (base != QLCDNumber::Dec) {
        bool of = num >= 2147483648.0 || num < -2147483648.0;
        if (of) {                             // oops, integer overflow
            if (oflow)
                *oflow = true;
            return s;
        }
        s = int2string((int)num, base, ndigits, nullptr);
    } else {                                    // decimal base
        int nd = ndigits;
        do {
            s = QString::asprintf("%*.*g", ndigits, nd, num);
            qsizetype i = s.indexOf(u'e');
            if (i > 0 && s[i+1]==u'+') {
                s[i] = u' ';
                s[i+1] = u'e';
            }
        } while (nd-- && (int)s.size() > ndigits);
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}